

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O1

Result __thiscall wabt::ExprVisitor::VisitExpr(ExprVisitor *this,Expr *root_expr)

{
  pointer *ppSVar1;
  pointer *pppEVar2;
  pointer *ppiVar3;
  pointer *ppuVar4;
  uint uVar5;
  pointer ppEVar6;
  pointer puVar7;
  Expr *expr;
  int iVar8;
  Result RVar9;
  pointer pSVar10;
  _func_int **pp_Var11;
  char *__function;
  pointer piVar12;
  Expr *pEVar13;
  Index catch_index;
  iterator iVar14;
  
  pSVar10 = (this->state_stack_).
            super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->state_stack_).
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_finish != pSVar10) {
    (this->state_stack_).
    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar10;
  }
  ppEVar6 = (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar6) {
    (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppEVar6;
  }
  piVar12 = (this->expr_iter_stack_).
            super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->expr_iter_stack_).
      super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
      ._M_impl.super__Vector_impl_data._M_finish != piVar12) {
    (this->expr_iter_stack_).
    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
    ._M_impl.super__Vector_impl_data._M_finish = piVar12;
  }
  puVar7 = (this->catch_index_stack_).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->catch_index_stack_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar7) {
    (this->catch_index_stack_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar7;
  }
  PushDefault(this,root_expr);
  pSVar10 = (this->state_stack_).
            super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((this->state_stack_).
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_start != pSVar10) {
    do {
      if (Catch < pSVar10[-1]) goto LAB_0015da56;
      expr = (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
             _M_impl.super__Vector_impl_data._M_finish[-1];
      switch(pSVar10[-1]) {
      case Default:
        ppSVar1 = &(this->state_stack_).
                   super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
        pppEVar2 = &(this->expr_stack_).
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppEVar2 = *pppEVar2 + -1;
        RVar9 = HandleDefaultState(this,expr);
        goto LAB_0015da51;
      case Block:
        if (expr->type_ != Block) {
          __function = 
          "Derived *wabt::cast(Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Block>, Base = wabt::Expr]"
          ;
          goto LAB_0015db0f;
        }
        piVar12 = (this->expr_iter_stack_).
                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (piVar12[-1].list_ !=
            (intrusive_list<wabt::Expr> *)&expr[5].super_intrusive_list_base<wabt::Expr>.prev_) {
LAB_0015da77:
          __assert_fail("list_ == rhs.list_",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                        ,0xbf,
                        "bool wabt::intrusive_list<wabt::Expr>::iterator::operator!=(iterator) const [T = wabt::Expr]"
                       );
        }
        if (piVar12[-1].node_ != (Expr *)0x0) {
LAB_0015d9ab:
          iVar14 = intrusive_list<wabt::Expr>::iterator::operator++(piVar12 + -1,0);
          if (iVar14.node_ == (Expr *)0x0) {
            __assert_fail("node_",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                          ,0x99,
                          "reference wabt::intrusive_list<wabt::Expr>::iterator::operator*() const [T = wabt::Expr]"
                         );
          }
          PushDefault(this,iVar14.node_);
          break;
        }
        iVar8 = (*this->delegate_->_vptr_Delegate[4])();
        goto LAB_0015d8b6;
      case IfTrue:
        if (expr->type_ != If) {
LAB_0015dacc:
          __function = "Derived *wabt::cast(Base *) [Derived = wabt::IfExpr, Base = wabt::Expr]";
LAB_0015db0f:
          __assert_fail("isa<Derived>(base)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/cast.h"
                        ,0x4e,__function);
        }
        piVar12 = (this->expr_iter_stack_).
                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (piVar12[-1].list_ !=
            (intrusive_list<wabt::Expr> *)&expr[5].super_intrusive_list_base<wabt::Expr>.prev_)
        goto LAB_0015da77;
        if (piVar12[-1].node_ != (Expr *)0x0) goto LAB_0015d9ab;
        iVar8 = (*this->delegate_->_vptr_Delegate[0x13])(this->delegate_,expr);
        if (iVar8 == 1) {
          return (Result)Error;
        }
        ppSVar1 = &(this->state_stack_).
                   super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
        pppEVar2 = &(this->expr_stack_).
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppEVar2 = *pppEVar2 + -1;
        ppiVar3 = &(this->expr_iter_stack_).
                   super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppiVar3 = *ppiVar3 + -1;
        PushExprlist(this,IfFalse,expr,(ExprList *)&expr[6].super_intrusive_list_base<wabt::Expr>);
        break;
      case IfFalse:
        if (expr->type_ != If) goto LAB_0015dacc;
        piVar12 = (this->expr_iter_stack_).
                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (piVar12[-1].list_ !=
            (intrusive_list<wabt::Expr> *)&expr[6].super_intrusive_list_base<wabt::Expr>)
        goto LAB_0015da77;
        if (piVar12[-1].node_ != (Expr *)0x0) goto LAB_0015d9ab;
        iVar8 = (*this->delegate_->_vptr_Delegate[0x14])();
        goto LAB_0015d8b6;
      case Loop:
        if (expr->type_ != Loop) {
          __function = 
          "Derived *wabt::cast(Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Loop>, Base = wabt::Expr]"
          ;
          goto LAB_0015db0f;
        }
        piVar12 = (this->expr_iter_stack_).
                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (piVar12[-1].list_ !=
            (intrusive_list<wabt::Expr> *)&expr[5].super_intrusive_list_base<wabt::Expr>.prev_)
        goto LAB_0015da77;
        if (piVar12[-1].node_ != (Expr *)0x0) goto LAB_0015d9ab;
        iVar8 = (*this->delegate_->_vptr_Delegate[0x1a])();
LAB_0015d8b6:
        if (iVar8 == 1) {
          return (Result)Error;
        }
        ppSVar1 = &(this->state_stack_).
                   super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
        pppEVar2 = &(this->expr_stack_).
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppEVar2 = *pppEVar2 + -1;
        ppiVar3 = &(this->expr_iter_stack_).
                   super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppiVar3 = *ppiVar3 + -1;
        break;
      case Try:
        if (expr->type_ != Try) {
LAB_0015dab5:
          __function = "Derived *wabt::cast(Base *) [Derived = wabt::TryExpr, Base = wabt::Expr]";
          goto LAB_0015db0f;
        }
        piVar12 = (this->expr_iter_stack_).
                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (piVar12[-1].list_ !=
            (intrusive_list<wabt::Expr> *)&expr[5].super_intrusive_list_base<wabt::Expr>.prev_)
        goto LAB_0015da77;
        if (piVar12[-1].node_ != (Expr *)0x0) goto LAB_0015d9ab;
        ppSVar1 = &(this->state_stack_).
                   super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
        pppEVar2 = &(this->expr_stack_).
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppEVar2 = *pppEVar2 + -1;
        ppiVar3 = &(this->expr_iter_stack_).
                   super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppiVar3 = *ppiVar3 + -1;
        iVar8 = *(int *)&expr->field_0x3c;
        if (iVar8 == 0) {
LAB_0015da31:
          pp_Var11 = this->delegate_->_vptr_Delegate;
        }
        else {
          if (iVar8 == 2) {
            RVar9.enum_ = (*this->delegate_->_vptr_Delegate[0x36])();
            goto LAB_0015da51;
          }
          if (iVar8 != 1) break;
          pEVar13 = expr[6].super_intrusive_list_base<wabt::Expr>.next_;
          pp_Var11 = this->delegate_->_vptr_Delegate;
          if (pEVar13 != expr[6].super_intrusive_list_base<wabt::Expr>.prev_) {
            iVar8 = (*pp_Var11[0x35])(this->delegate_,expr,pEVar13);
            if (iVar8 == 1) {
              return (Result)Error;
            }
            catch_index = 0;
            goto LAB_0015da2a;
          }
        }
        RVar9.enum_ = (*pp_Var11[0x37])();
LAB_0015da51:
        if (RVar9.enum_ == Error) {
          return (Result)Error;
        }
        break;
      case Catch:
        if (expr->type_ != Try) goto LAB_0015dab5;
        piVar12 = (this->expr_iter_stack_).
                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        uVar5 = (this->catch_index_stack_).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish[-1];
        pEVar13 = expr[6].super_intrusive_list_base<wabt::Expr>.next_;
        if (piVar12[-1].list_ !=
            (intrusive_list<wabt::Expr> *)&pEVar13[(ulong)uVar5 * 2 + 1].loc.field_1)
        goto LAB_0015da77;
        if (piVar12[-1].node_ != (Expr *)0x0) goto LAB_0015d9ab;
        ppSVar1 = &(this->state_stack_).
                   super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
        pppEVar2 = &(this->expr_stack_).
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppEVar2 = *pppEVar2 + -1;
        ppiVar3 = &(this->expr_iter_stack_).
                   super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppiVar3 = *ppiVar3 + -1;
        ppuVar4 = &(this->catch_index_stack_).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar4 = *ppuVar4 + -1;
        catch_index = uVar5 + 1;
        if ((ulong)((long)expr[6].super_intrusive_list_base<wabt::Expr>.prev_ - (long)pEVar13 >> 7)
            <= (ulong)catch_index) goto LAB_0015da31;
        pEVar13 = pEVar13 + (ulong)catch_index * 2;
        iVar8 = (*this->delegate_->_vptr_Delegate[0x35])(this->delegate_,expr,pEVar13);
        if (iVar8 == 1) {
          return (Result)Error;
        }
LAB_0015da2a:
        PushCatch(this,expr,catch_index,(ExprList *)&pEVar13[1].loc.field_1.field_0);
      }
LAB_0015da56:
      pSVar10 = (this->state_stack_).
                super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while ((this->state_stack_).
             super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
             ._M_impl.super__Vector_impl_data._M_start != pSVar10);
  }
  return (Result)Ok;
}

Assistant:

Result ExprVisitor::VisitExpr(Expr* root_expr) {
  state_stack_.clear();
  expr_stack_.clear();
  expr_iter_stack_.clear();
  catch_index_stack_.clear();

  PushDefault(root_expr);

  while (!state_stack_.empty()) {
    State state = state_stack_.back();
    auto* expr = expr_stack_.back();

    switch (state) {
      case State::Default:
        PopDefault();
        CHECK_RESULT(HandleDefaultState(expr));
        break;

      case State::Block: {
        auto block_expr = cast<BlockExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != block_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndBlockExpr(block_expr));
          PopExprlist();
        }
        break;
      }

      case State::IfTrue: {
        auto if_expr = cast<IfExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != if_expr->true_.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->AfterIfTrueExpr(if_expr));
          PopExprlist();
          PushExprlist(State::IfFalse, expr, if_expr->false_);
        }
        break;
      }

      case State::IfFalse: {
        auto if_expr = cast<IfExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != if_expr->false_.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndIfExpr(if_expr));
          PopExprlist();
        }
        break;
      }

      case State::Loop: {
        auto loop_expr = cast<LoopExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != loop_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndLoopExpr(loop_expr));
          PopExprlist();
        }
        break;
      }

      case State::Try: {
        auto try_expr = cast<TryExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != try_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          PopExprlist();
          switch (try_expr->kind) {
            case TryKind::Catch:
              if (!try_expr->catches.empty()) {
                Catch& catch_ = try_expr->catches[0];
                CHECK_RESULT(delegate_->OnCatchExpr(try_expr, &catch_));
                PushCatch(expr, 0, catch_.exprs);
              } else {
                CHECK_RESULT(delegate_->EndTryExpr(try_expr));
              }
              break;
            case TryKind::Delegate:
              CHECK_RESULT(delegate_->OnDelegateExpr(try_expr));
              break;
            case TryKind::Plain:
              CHECK_RESULT(delegate_->EndTryExpr(try_expr));
              break;
          }
        }
        break;
      }

      case State::Catch: {
        auto try_expr = cast<TryExpr>(expr);
        Index catch_index = catch_index_stack_.back();
        auto& iter = expr_iter_stack_.back();
        if (iter != try_expr->catches[catch_index].exprs.end()) {
          PushDefault(&*iter++);
        } else {
          PopCatch();
          catch_index++;
          if (catch_index < try_expr->catches.size()) {
            Catch& catch_ = try_expr->catches[catch_index];
            CHECK_RESULT(delegate_->OnCatchExpr(try_expr, &catch_));
            PushCatch(expr, catch_index, catch_.exprs);
          } else {
            CHECK_RESULT(delegate_->EndTryExpr(try_expr));
          }
        }
        break;
      }
    }
  }

  return Result::Ok;
}